

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agc_manager_direct.cc
# Opt level: O0

void __thiscall
webrtc::AgcManagerDirect::AgcManagerDirect
          (AgcManagerDirect *this,Agc *agc,GainControl *gctrl,VolumeCallbacks *volume_callbacks,
          int startup_min_level)

{
  int iVar1;
  DebugFile *pDVar2;
  int startup_min_level_local;
  VolumeCallbacks *volume_callbacks_local;
  GainControl *gctrl_local;
  Agc *agc_local;
  AgcManagerDirect *this_local;
  
  std::unique_ptr<webrtc::Agc,std::default_delete<webrtc::Agc>>::
  unique_ptr<std::default_delete<webrtc::Agc>,void>
            ((unique_ptr<webrtc::Agc,std::default_delete<webrtc::Agc>> *)this,agc);
  this->gctrl_ = gctrl;
  this->volume_callbacks_ = volume_callbacks;
  this->frames_since_clipped_ = 300;
  this->level_ = 0;
  this->max_level_ = 0xff;
  this->max_compression_gain_ = 0xc;
  this->target_compression_ = 7;
  this->compression_ = this->target_compression_;
  this->compression_accumulator_ = (float)this->compression_;
  this->capture_muted_ = false;
  this->check_volume_on_next_process_ = true;
  this->startup_ = true;
  iVar1 = anon_unknown_0::ClampLevel(startup_min_level);
  this->startup_min_level_ = iVar1;
  pDVar2 = (DebugFile *)operator_new(1);
  DebugFile::DebugFile(pDVar2,"agc_preproc.pcm");
  std::unique_ptr<webrtc::DebugFile,std::default_delete<webrtc::DebugFile>>::
  unique_ptr<std::default_delete<webrtc::DebugFile>,void>
            ((unique_ptr<webrtc::DebugFile,std::default_delete<webrtc::DebugFile>> *)
             &this->file_preproc_,pDVar2);
  pDVar2 = (DebugFile *)operator_new(1);
  DebugFile::DebugFile(pDVar2,"agc_postproc.pcm");
  std::unique_ptr<webrtc::DebugFile,std::default_delete<webrtc::DebugFile>>::
  unique_ptr<std::default_delete<webrtc::DebugFile>,void>
            ((unique_ptr<webrtc::DebugFile,std::default_delete<webrtc::DebugFile>> *)
             &this->file_postproc_,pDVar2);
  return;
}

Assistant:

AgcManagerDirect::AgcManagerDirect(Agc* agc,
                                   GainControl* gctrl,
                                   VolumeCallbacks* volume_callbacks,
                                   int startup_min_level)
    : agc_(agc),
      gctrl_(gctrl),
      volume_callbacks_(volume_callbacks),
      frames_since_clipped_(kClippedWaitFrames),
      level_(0),
      max_level_(kMaxMicLevel),
      max_compression_gain_(kMaxCompressionGain),
      target_compression_(kDefaultCompressionGain),
      compression_(target_compression_),
      compression_accumulator_(compression_),
      capture_muted_(false),
      check_volume_on_next_process_(true),  // Check at startup.
      startup_(true),
      startup_min_level_(ClampLevel(startup_min_level)),
      file_preproc_(new DebugFile("agc_preproc.pcm")),
      file_postproc_(new DebugFile("agc_postproc.pcm")) {
}